

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::~VcprojGenerator(VcprojGenerator *this)

{
  (this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
  _vptr_QMakeSourceFileInfo = (_func_int **)&PTR_fixPathForFile_00268dc8;
  if (this->projectWriter != (VCProjectWriter *)0x0) {
    (*this->projectWriter->_vptr_VCProjectWriter[1])();
  }
  QArrayDataPointer<VcprojGenerator_*>::~QArrayDataPointer(&(this->mergedProjects).d);
  VCProjectSingleConfig::~VCProjectSingleConfig(&this->vcProject);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->customBuildToolFilterFileSuffix).d);
  QHash<QString,_QString>::~QHash(&this->extraCompilerOutputs);
  QHash<QString,_QList<QString>_>::~QHash(&this->extraCompilerSources);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->precompPch).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->precompObj).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->precompSource).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->precompHFilename).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->precompH).d);
  MakefileGenerator::~MakefileGenerator((MakefileGenerator *)this);
  return;
}

Assistant:

VcprojGenerator::~VcprojGenerator()
{
    delete projectWriter;
}